

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O0

void __thiscall duckdb::OperatorProfiler::Flush(OperatorProfiler *this,PhysicalOperator *phys_op)

{
  bool bVar1;
  reference_wrapper<const_duckdb::PhysicalOperator> *this_00;
  PhysicalOperator *__uref;
  pointer ppVar2;
  long *in_RSI;
  long in_RDI;
  OperatorInformation *info;
  iterator entry;
  PhysicalOperator *in_stack_ffffffffffffff88;
  string local_60 [40];
  _Node_iterator_base<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_true>
  local_38;
  string *local_30;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_true>
  local_28 [2];
  _Node_iterator_base<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_true>
  local_18;
  long *local_10;
  
  this_00 = (reference_wrapper<const_duckdb::PhysicalOperator> *)(in_RDI + 0x68);
  local_10 = in_RSI;
  ::std::reference_wrapper<duckdb::PhysicalOperator_const>::
  reference_wrapper<duckdb::PhysicalOperator_const&,void,duckdb::PhysicalOperator_const*>
            (this_00,in_stack_ffffffffffffff88);
  local_18._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>_>
       ::find((unordered_map<std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>_>
               *)in_stack_ffffffffffffff88,(key_type *)0x89cbbf);
  local_28[0]._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>_>
       ::end((unordered_map<std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>_>
              *)in_stack_ffffffffffffff88);
  bVar1 = ::std::__detail::operator==(&local_18,local_28);
  if (!bVar1) {
    __uref = (PhysicalOperator *)(in_RDI + 0x68);
    ::std::reference_wrapper<duckdb::PhysicalOperator_const>::
    reference_wrapper<duckdb::PhysicalOperator_const&,void,duckdb::PhysicalOperator_const*>
              (this_00,__uref);
    local_38._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>_>
         ::find((unordered_map<std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>_>
                 *)__uref,(key_type *)0x89cc18);
    ppVar2 = ::std::__detail::
             _Node_iterator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_false,_true>
                           *)0x89cc27);
    local_30 = (string *)&ppVar2->second;
    (**(code **)(*local_10 + 0x10))(local_60);
    ::std::__cxx11::string::operator=(local_30,local_60);
    ::std::__cxx11::string::~string(local_60);
  }
  return;
}

Assistant:

void OperatorProfiler::Flush(const PhysicalOperator &phys_op) {
	auto entry = operator_infos.find(phys_op);
	if (entry == operator_infos.end()) {
		return;
	}

	auto &info = operator_infos.find(phys_op)->second;
	info.name = phys_op.GetName();
}